

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O0

float __thiscall
gimage::GaussKernel::convolveHorizontal<float>
          (GaussKernel *this,Image<float,_gimage::PixelTraits<float>_> *image,long i,long k,int d)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long in_RCX;
  long in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  long *in_RDI;
  int in_R8D;
  store_t_conflict1 sVar4;
  int jj_1;
  long j_1;
  float ps;
  float pv_1;
  long j;
  int jj;
  float pv;
  long local_50;
  float local_48;
  float local_44;
  long local_40;
  int local_34;
  float local_30;
  
  if ((*(int *)((long)in_RDI + 0xc) <= in_RDX) &&
     (lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI),
     in_RDX < lVar3 - *(int *)((long)in_RDI + 0xc))) {
    local_30 = 0.0;
    local_34 = (int)in_RDX - *(int *)((long)in_RDI + 0xc);
    for (local_40 = 0; local_40 < (int)in_RDI[1]; local_40 = local_40 + 1) {
      fVar1 = *(float *)(*in_RDI + local_40 * 4);
      sVar4 = Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,(long)local_34,in_RCX,in_R8D);
      local_30 = fVar1 * sVar4 + local_30;
      local_34 = local_34 + 1;
    }
    return local_30;
  }
  local_44 = 0.0;
  local_48 = 0.0;
  for (local_50 = 0; local_50 < (int)in_RDI[1]; local_50 = local_50 + 1) {
    iVar2 = ((int)in_RDX - *(int *)((long)in_RDI + 0xc)) + (int)local_50;
    if ((-1 < iVar2) &&
       (lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI), iVar2 < lVar3)) {
      fVar1 = *(float *)(*in_RDI + local_50 * 4);
      sVar4 = Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,(long)iVar2,in_RCX,in_R8D);
      local_44 = fVar1 * sVar4 + local_44;
      local_48 = *(float *)(*in_RDI + local_50 * 4) + local_48;
    }
  }
  return local_44 / local_48;
}

Assistant:

inline float convolveHorizontal(const Image<T> &image,
        long i, long k, int d) const
    {
      if (i >= kn2 && i < image.getWidth()-kn2)
      {
        float pv=0;

        int jj=i-kn2;
        for (long j=0; j<kn; j++)
        {
          pv+=kernel[j]*image.get(jj++, k, d);
        }

        return pv;
      }
      else
      {
        float pv=0;
        float ps=0;

        for (long j=0; j<kn; j++)
        {
          int jj=i-kn2+j;

          if (jj >= 0 && jj < image.getWidth())
          {
            pv+=kernel[j]*image.get(jj, k, d);
            ps+=kernel[j];
          }
        }

        return pv/ps;
      }
    }